

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O3

void __thiscall
ExprWriterTest_PairwiseExprPrecedence_Test::TestBody
          (ExprWriterTest_PairwiseExprPrecedence_Test *this)

{
  vector<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  *this_00;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *args_00;
  bool bVar1;
  Impl *pIVar2;
  Impl *pIVar3;
  PairwiseExpr PVar4;
  char *message;
  AssertionResult gtest_ar;
  NumericExpr args [2];
  AssertHelper local_b0;
  string local_a8;
  internal local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> local_78;
  Impl *local_50;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> local_48;
  Impl *local_40;
  
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory.exprs_;
  local_a8._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_a8);
  pIVar2 = (Impl *)operator_new__(0x80);
  pIVar2->kind_ = FIRST_EXPR;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar2;
  *(undefined8 *)(pIVar2 + 2) = 0;
  local_a8._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_a8);
  pIVar3 = (Impl *)operator_new__(0x80);
  pIVar3->kind_ = FIRST_EXPR;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar3;
  *(undefined8 *)(pIVar3 + 2) = 0x3ff0000000000000;
  local_a8._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_a8);
  local_48.super_ExprBase.impl_ = (ExprBase)operator_new__(0xc0);
  ((Impl *)local_48.super_ExprBase.impl_)->kind_ = ADD;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = (Impl *)local_48.super_ExprBase.impl_;
  *(Impl **)((long)local_48.super_ExprBase.impl_ + 8) = pIVar2;
  *(Impl **)((long)local_48.super_ExprBase.impl_ + 0x10) = pIVar3;
  local_a8._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_a8);
  local_40 = (Impl *)operator_new__(0xc0);
  local_40->kind_ = ADD;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = local_40;
  *(Impl **)(local_40 + 2) = pIVar2;
  *(Impl **)(local_40 + 4) = pIVar3;
  local_78.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.size_ = 2;
  local_78.data_ = &local_48;
  PVar4 = ExprWriterTest::MakePairwise(&this->super_ExprWriterTest,ALLDIFF,&local_78);
  local_b0.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_b0);
  local_50 = (Impl *)operator_new__(0x100);
  local_50->kind_ = IF;
  args_00 = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
            (this->super_ExprWriterTest).super_ExprFactory.exprs_.
            super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  args_00[-1].super_ExprBase.impl_ = local_50;
  *(BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69> *)&local_50[2].kind_ =
       PVar4.super_BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69>.super_ExprBase.impl_;
  *(Impl **)(local_50 + 4) = pIVar3;
  *(Impl **)(local_50 + 6) = pIVar2;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_a8,(fmt *)0x1674c5,(CStringRef)&local_50,args_00);
  testing::internal::CmpHelperEQ<char[32],std::__cxx11::string>
            (local_88,"\"if alldiff(0 + 1, 0 + 1) then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakePairwise(ex::ALLDIFF, args), n1, n0)))"
             ,(char (*) [32])"if alldiff(0 + 1, 0 + 1) then 1",&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_78.save_.
      super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.save_.
                    super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.save_.
                          super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.save_.
                          super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2fa,message);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprWriterTest, PairwiseExprPrecedence) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  NumericExpr args[] = {
    MakeBinary(ex::ADD, n0, n1), MakeBinary(ex::ADD, n0, n1)
  };
  CHECK_WRITE("if alldiff(0 + 1, 0 + 1) then 1",
      MakeIf(MakePairwise(ex::ALLDIFF, args), n1, n0));
}